

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_install_info.cpp
# Opt level: O1

string * duckdb::ExtensionRepository::TryGetRepositoryUrl
                   (string *__return_storage_ptr__,string *repository)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  
  iVar1 = ::std::__cxx11::string::compare((char *)repository);
  if (iVar1 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "http://extensions.duckdb.org";
    pcVar2 = "";
  }
  else {
    iVar1 = ::std::__cxx11::string::compare((char *)repository);
    if (iVar1 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "http://nightly-extensions.duckdb.org";
      pcVar2 = "";
    }
    else {
      iVar1 = ::std::__cxx11::string::compare((char *)repository);
      if (iVar1 == 0) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "http://community-extensions.duckdb.org";
        pcVar2 = "";
      }
      else {
        iVar1 = ::std::__cxx11::string::compare((char *)repository);
        if (iVar1 == 0) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar3 = "./build/debug/repository";
          pcVar2 = "";
        }
        else {
          iVar1 = ::std::__cxx11::string::compare((char *)repository);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          if (iVar1 == 0) {
            pcVar3 = "./build/release/repository";
            pcVar2 = "";
          }
          else {
            pcVar2 = anon_var_dwarf_643533f + 9;
            pcVar3 = anon_var_dwarf_643533f + 9;
          }
        }
      }
    }
  }
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

string ExtensionRepository::TryGetRepositoryUrl(const string &repository) {
	if (repository == "core") {
		return CORE_REPOSITORY_URL;
	} else if (repository == "core_nightly") {
		return CORE_NIGHTLY_REPOSITORY_URL;
	} else if (repository == "community") {
		return COMMUNITY_REPOSITORY_URL;
	} else if (repository == "local_build_debug") {
		return BUILD_DEBUG_REPOSITORY_PATH;
	} else if (repository == "local_build_release") {
		return BUILD_RELEASE_REPOSITORY_PATH;
	}
	return "";
}